

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.h
# Opt level: O2

int __thiscall Sequence::get_file_l2(Sequence *this)

{
  ostream *poVar1;
  element_type *peVar2;
  int l2cnt;
  
  l2cnt = 0;
  peVar2 = (this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (1 < peVar2->max_iset_len) {
    InvertDatabase::get_l2file
              ((this->invdb).super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &peVar2->it2f,'\0',&l2cnt);
    peVar2 = (this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (1 < peVar2->max_seq_len) {
    InvertDatabase::get_l2file
              ((this->invdb).super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &peVar2->seqf,'\x01',&l2cnt);
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"L2 : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,l2cnt);
  std::endl<char,std::char_traits<char>>(poVar1);
  return l2cnt;
}

Assistant:

int get_file_l2() {
        int l2cnt = 0;

        if (args->max_iset_len > 1) {
            invdb->get_l2file(args->it2f, 0, l2cnt);
        }
        if (args->max_seq_len > 1) {
            invdb->get_l2file(args->seqf, 1, l2cnt);
        }

        cerr << "L2 : " << l2cnt << endl;
        return l2cnt;
    }